

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall duckdb::ParquetOptions::ParquetOptions(ParquetOptions *this,ClientContext *context)

{
  SettingLookupResult SVar1;
  bool bVar2;
  allocator local_91;
  LogicalType local_90;
  string local_78;
  Value binary_as_string_val;
  
  this->binary_as_string = false;
  this->file_row_number = false;
  (this->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->encryption_config).internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->debug_use_openssl = true;
  (this->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->schema).
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->explicit_cardinality = 0;
  LogicalType::LogicalType(&local_90,SQLNULL);
  Value::Value(&binary_as_string_val,&local_90);
  LogicalType::~LogicalType(&local_90);
  ::std::__cxx11::string::string((string *)&local_78,"binary_as_string",&local_91);
  SVar1 = ClientContext::TryGetCurrentSetting(context,&local_78,&binary_as_string_val);
  ::std::__cxx11::string::~string((string *)&local_78);
  if (SVar1.scope != INVALID) {
    bVar2 = Value::GetValue<bool>(&binary_as_string_val);
    this->binary_as_string = bVar2;
  }
  Value::~Value(&binary_as_string_val);
  return;
}

Assistant:

ParquetOptions::ParquetOptions(ClientContext &context) {
	Value binary_as_string_val;
	if (context.TryGetCurrentSetting("binary_as_string", binary_as_string_val)) {
		binary_as_string = binary_as_string_val.GetValue<bool>();
	}
}